

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O1

void test_tcp_stream(void)

{
  uint16_t uVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  nng_stream *s;
  nng_stream *s_00;
  size_t sVar5;
  char local_1e8 [8];
  char uri [64];
  nng_sockaddr sa2;
  nng_sockaddr sa;
  nng_iov iov;
  nng_aio *maio;
  nng_stream_dialer *pnStack_78;
  uint8_t ip [4];
  nng_stream_dialer *d;
  char buf1 [5];
  char buf2 [5];
  nng_stream_listener *l;
  nng_aio *daio;
  nng_aio *laio;
  nng_aio *aio1;
  nng_aio *aio2;
  _Bool on;
  
  pnStack_78 = (nng_stream_dialer *)0x0;
  _buf2 = (nng_stream_listener *)0x0;
  l = (nng_stream_listener *)0x0;
  daio = (nng_aio *)0x0;
  iov.iov_len = 0;
  nVar2 = nng_aio_alloc((nng_aio **)&l,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x26,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&daio, NULL, NULL)",pcVar4,nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_aio_alloc(&daio,(_func_void_void_ptr *)0x0,(void *)0x0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                           ,0x27,"%s: expected success, got %s (%d)",
                           "nng_aio_alloc(&laio, NULL, NULL)",pcVar4,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_aio_alloc((nng_aio **)&iov.iov_len,(_func_void_void_ptr *)0x0,(void *)0x0);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                             ,0x28,"%s: expected success, got %s (%d)",
                             "nng_aio_alloc(&maio, NULL, NULL)",pcVar4,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_aio_alloc(&laio,(_func_void_void_ptr *)0x0,(void *)0x0);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                               ,0x29,"%s: expected success, got %s (%d)",
                               "nng_aio_alloc(&aio1, NULL, NULL)",pcVar4,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_aio_alloc(&aio1,(_func_void_void_ptr *)0x0,(void *)0x0);
          pcVar4 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                 ,0x2a,"%s: expected success, got %s (%d)",
                                 "nng_aio_alloc(&aio2, NULL, NULL)",pcVar4,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_stream_listener_alloc((nng_stream_listener **)buf2,"tcp://127.0.0.1");
            pcVar4 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                   ,0x2c,"%s: expected success, got %s (%d)",
                                   "nng_stream_listener_alloc(&l, \"tcp://127.0.0.1\")",pcVar4,nVar2
                                  );
            if (iVar3 != 0) {
              nVar2 = nng_stream_listener_listen(_buf2);
              pcVar4 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                     ,0x2d,"%s: expected success, got %s (%d)",
                                     "nng_stream_listener_listen(l)",pcVar4,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_stream_listener_get_addr
                                  (_buf2,"local-address",(nng_sockaddr *)(sa2.s_ipc.sa_path + 0x7e))
                ;
                pcVar4 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                       ,0x33,"%s: expected success, got %s (%d)",
                                       "nng_stream_listener_get_addr(l, NNG_OPT_LOCADDR, &sa)",
                                       pcVar4,nVar2);
                if (iVar3 != 0) {
                  acutest_check_((uint)(sa2.s_storage.sa_pad[0xf]._2_2_ != 0),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                 ,0x34,"%s","sa.s_in.sa_port != 0");
                  iVar3 = acutest_check_((uint)(sa2.s_storage.sa_pad[0xf]._4_4_ == 0x100007f),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                         ,0x35,"%s","memcmp(&sa.s_in.sa_addr, ip, 4) == 0");
                  uVar1 = nuts_be16((uint16_t)iVar3);
                  snprintf(local_1e8,0x40,"tcp://127.0.0.1:%d",(ulong)uVar1);
                  nVar2 = nng_stream_dialer_alloc(&stack0xffffffffffffff88,local_1e8);
                  pcVar4 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                         ,0x3b,"%s: expected success, got %s (%d)",
                                         "nng_stream_dialer_alloc(&d, uri)",pcVar4,nVar2);
                  if (iVar3 != 0) {
                    nng_stream_dialer_dial(pnStack_78,(nng_aio *)l);
                    nng_stream_listener_accept(_buf2,daio);
                    nng_aio_wait((nng_aio *)l);
                    nVar2 = nng_aio_result((nng_aio *)l);
                    pcVar4 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                           ,0x40,"%s: expected success, got %s (%d)",
                                           "nng_aio_result(daio)",pcVar4,nVar2);
                    if (iVar3 != 0) {
                      nng_aio_wait(daio);
                      nVar2 = nng_aio_result(daio);
                      pcVar4 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                             ,0x42,"%s: expected success, got %s (%d)",
                                             "nng_aio_result(laio)",pcVar4,nVar2);
                      if (iVar3 != 0) {
                        s = (nng_stream *)nng_aio_get_output((nng_aio *)l,0);
                        s_00 = (nng_stream *)nng_aio_get_output(daio,0);
                        acutest_check_((uint)(s != (nng_stream *)0x0),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                       ,0x46,"%s","c1 != NULL");
                        acutest_check_((uint)(s_00 != (nng_stream *)0x0),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                       ,0x47,"%s","c2 != NULL");
                        aio2._7_1_ = 0;
                        nVar2 = nng_stream_get_bool(s,"tcp-nodelay",(_Bool *)((long)&aio2 + 7));
                        pcVar4 = nng_strerror(nVar2);
                        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                               ,0x4a,"%s: expected success, got %s (%d)",
                                               "nng_stream_get_bool(c1, NNG_OPT_TCP_NODELAY, &on)",
                                               pcVar4,nVar2);
                        if (iVar3 != 0) {
                          acutest_check_((uint)aio2._7_1_,
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                         ,0x4b,"%s","on");
                          aio2._7_1_ = 0;
                          nVar2 = nng_stream_get_bool(s,"tcp-keepalive",(_Bool *)((long)&aio2 + 7));
                          pcVar4 = nng_strerror(nVar2);
                          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                 ,0x4e,"%s: expected success, got %s (%d)",
                                                 "nng_stream_get_bool(c1, NNG_OPT_TCP_KEEPALIVE, &on)"
                                                 ,pcVar4,nVar2);
                          if (iVar3 != 0) {
                            sa.s_storage.sa_pad[0xf] = (uint64_t)&d;
                            d._4_1_ = '\0';
                            d._0_4_ = 0x54534554;
                            buf1[4] = '\0';
                            buf1[0] = '\0';
                            buf1[1] = '\0';
                            buf1[2] = '\0';
                            buf1[3] = '\0';
                            iov.iov_buf = (void *)0x5;
                            nng_aio_set_iov(laio,1,(nng_iov *)(sa.s_ipc.sa_path + 0x7e));
                            iov.iov_buf = (void *)0x5;
                            sa.s_storage.sa_pad[0xf] = (uint64_t)buf1;
                            nng_aio_set_iov(aio1,1,(nng_iov *)(sa.s_ipc.sa_path + 0x7e));
                            nng_stream_send(s,laio);
                            nng_stream_recv(s_00,aio1);
                            nng_aio_wait(laio);
                            nng_aio_wait(aio1);
                            nVar2 = nng_aio_result(laio);
                            pcVar4 = nng_strerror(nVar2);
                            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,100,"%s: expected success, got %s (%d)",
                                                  "nng_aio_result(aio1)",pcVar4,nVar2);
                            if (iVar3 != 0) {
                              sVar5 = nng_aio_count(laio);
                              acutest_check_((uint)(sVar5 == 5),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                             ,0x65,"%s","nng_aio_count(aio1) == 5");
                              nVar2 = nng_aio_result(aio1);
                              pcVar4 = nng_strerror(nVar2);
                              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x67,"%s: expected success, got %s (%d)",
                                                  "nng_aio_result(aio2)",pcVar4,nVar2);
                              if (iVar3 != 0) {
                                sVar5 = nng_aio_count(aio1);
                                acutest_check_((uint)(sVar5 == 5),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                               ,0x68,"%s","nng_aio_count(aio2) == 5");
                                acutest_check_((uint)(d._4_1_ == buf1[4] && (int)d == buf1._0_4_),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                               ,0x6a,"%s","memcmp(buf1, buf2, 5) == 0");
                                nVar2 = nng_stream_get_addr(s_00,"local-address",
                                                            (nng_sockaddr *)(uri + 0x38));
                                pcVar4 = nng_strerror(nVar2);
                                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x6c,"%s: expected success, got %s (%d)",
                                                  "nng_stream_get_addr(c2, NNG_OPT_LOCADDR, &sa2)",
                                                  pcVar4,nVar2);
                                if (iVar3 != 0) {
                                  acutest_check_((uint)(uri._56_2_ == 3),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                 ,0x6d,"%s","sa2.s_in.sa_family == NNG_AF_INET");
                                  acutest_check_((uint)(uri._60_4_ ==
                                                       sa2.s_storage.sa_pad[0xf]._4_4_),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                 ,0x6f,"%s","sa2.s_in.sa_addr == sa.s_in.sa_addr");
                                  acutest_check_((uint)(uri._58_2_ ==
                                                       sa2.s_storage.sa_pad[0xf]._2_2_),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                 ,0x70,"%s","sa2.s_in.sa_port == sa.s_in.sa_port");
                                  nVar2 = nng_stream_get_addr(s,"remote-address",
                                                              (nng_sockaddr *)(uri + 0x38));
                                  pcVar4 = nng_strerror(nVar2);
                                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x72,"%s: expected success, got %s (%d)",
                                                  "nng_stream_get_addr(c1, NNG_OPT_REMADDR, &sa2)",
                                                  pcVar4,nVar2);
                                  if (iVar3 != 0) {
                                    acutest_check_((uint)(uri._56_2_ == 3),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x73,"%s","sa2.s_in.sa_family == NNG_AF_INET");
                                    acutest_check_((uint)(uri._60_4_ ==
                                                         sa2.s_storage.sa_pad[0xf]._4_4_),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x74,"%s","sa2.s_in.sa_addr == sa.s_in.sa_addr");
                                    acutest_check_((uint)(uri._58_2_ ==
                                                         sa2.s_storage.sa_pad[0xf]._2_2_),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                                                  ,0x75,"%s","sa2.s_in.sa_port == sa.s_in.sa_port");
                                    nng_stream_listener_free(_buf2);
                                    nng_stream_dialer_free(pnStack_78);
                                    nng_aio_free(laio);
                                    nng_aio_free(aio1);
                                    nng_aio_free((nng_aio *)l);
                                    nng_aio_free(daio);
                                    nng_aio_free((nng_aio *)iov.iov_len);
                                    nng_stream_close(s);
                                    nng_stream_close(s_00);
                                    nng_stream_stop(s);
                                    nng_stream_stop(s_00);
                                    nng_stream_free(s);
                                    nng_stream_free(s_00);
                                    return;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_tcp_stream(void)
{
	nng_stream_dialer   *d = NULL;
	nng_stream_listener *l = NULL;
	nng_sockaddr         sa;
	uint8_t              ip[4];
	nng_aio             *daio = NULL;
	nng_aio             *laio = NULL;
	nng_aio             *maio = NULL;
	nng_stream          *c1   = NULL;
	nng_stream          *c2   = NULL;
	nng_aio             *aio1;
	nng_aio             *aio2;
	nng_iov              iov;
	nng_sockaddr         sa2;
	char                 buf1[5];
	char                 buf2[5];
	bool                 on;

	NUTS_PASS(nng_aio_alloc(&daio, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&laio, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&maio, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	NUTS_PASS(nng_stream_listener_alloc(&l, "tcp://127.0.0.1"));
	NUTS_PASS(nng_stream_listener_listen(l));

	ip[0] = 127;
	ip[1] = 0;
	ip[2] = 0;
	ip[3] = 1;
	NUTS_PASS(nng_stream_listener_get_addr(l, NNG_OPT_LOCADDR, &sa));
	NUTS_TRUE(sa.s_in.sa_port != 0);
	NUTS_TRUE(memcmp(&sa.s_in.sa_addr, ip, 4) == 0);

	char uri[64];
	snprintf(uri, sizeof(uri), "tcp://127.0.0.1:%d",
	    nuts_be16(sa.s_in.sa_port));

	NUTS_PASS(nng_stream_dialer_alloc(&d, uri));
	nng_stream_dialer_dial(d, daio);
	nng_stream_listener_accept(l, laio);

	nng_aio_wait(daio);
	NUTS_PASS(nng_aio_result(daio));
	nng_aio_wait(laio);
	NUTS_PASS(nng_aio_result(laio));

	c1 = nng_aio_get_output(daio, 0);
	c2 = nng_aio_get_output(laio, 0);
	NUTS_TRUE(c1 != NULL);
	NUTS_TRUE(c2 != NULL);

	on = false;
	NUTS_PASS(nng_stream_get_bool(c1, NNG_OPT_TCP_NODELAY, &on));
	NUTS_TRUE(on);

	on = false;
	NUTS_PASS(nng_stream_get_bool(c1, NNG_OPT_TCP_KEEPALIVE, &on));

	// This relies on send completing for
	// for just 5 bytes, and on recv doing
	// the same.  Technically this isn't
	// guaranteed, but it would be weird
	// to split such a small payload.
	memcpy(buf1, "TEST", 5);
	memset(buf2, 0, 5);
	iov.iov_buf = buf1;
	iov.iov_len = 5;

	nng_aio_set_iov(aio1, 1, &iov);

	iov.iov_buf = buf2;
	iov.iov_len = 5;
	nng_aio_set_iov(aio2, 1, &iov);
	nng_stream_send(c1, aio1);
	nng_stream_recv(c2, aio2);
	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_TRUE(nng_aio_count(aio1) == 5);

	NUTS_PASS(nng_aio_result(aio2));
	NUTS_TRUE(nng_aio_count(aio2) == 5);

	NUTS_TRUE(memcmp(buf1, buf2, 5) == 0);

	NUTS_PASS(nng_stream_get_addr(c2, NNG_OPT_LOCADDR, &sa2));
	NUTS_TRUE(sa2.s_in.sa_family == NNG_AF_INET);

	NUTS_TRUE(sa2.s_in.sa_addr == sa.s_in.sa_addr);
	NUTS_TRUE(sa2.s_in.sa_port == sa.s_in.sa_port);

	NUTS_PASS(nng_stream_get_addr(c1, NNG_OPT_REMADDR, &sa2));
	NUTS_TRUE(sa2.s_in.sa_family == NNG_AF_INET);
	NUTS_TRUE(sa2.s_in.sa_addr == sa.s_in.sa_addr);
	NUTS_TRUE(sa2.s_in.sa_port == sa.s_in.sa_port);

	nng_stream_listener_free(l);
	nng_stream_dialer_free(d);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
	nng_aio_free(daio);
	nng_aio_free(laio);
	nng_aio_free(maio);
	nng_stream_close(c1);
	nng_stream_close(c2);
	nng_stream_stop(c1);
	nng_stream_stop(c2);
	nng_stream_free(c1);
	nng_stream_free(c2);
}